

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O0

float collision_cleanup(features *fs)

{
  float fVar1;
  undefined8 uVar2;
  long lVar3;
  bool bVar4;
  features_value_index_iterator *this;
  long *plVar5;
  char *pcVar6;
  feature_value *pfVar7;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  features_value_iterator *rhs;
  long in_RDI;
  iterator *f;
  iterator __end1;
  iterator __begin1;
  features *__range1;
  iterator pos;
  float sum_sq;
  uint64_t last_index;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  feature_value fVar8;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  features_value_iterator local_50;
  features_value_iterator *in_stack_ffffffffffffffb8;
  features_value_iterator in_stack_ffffffffffffffc0;
  features_value_index_iterator local_28;
  float local_14;
  long local_10;
  long local_8;
  
  local_10 = -1;
  local_14 = 0.0;
  local_8 = in_RDI;
  features::begin((features *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  features::begin((features *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  features::end((features *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  while( true ) {
    rhs = &local_50;
    bVar4 = features_value_iterator::operator!=
                      ((features_value_iterator *)&stack0xffffffffffffffc0,rhs);
    if (!bVar4) break;
    this = features_value_index_iterator::operator*
                     ((features_value_index_iterator *)&stack0xffffffffffffffc0);
    lVar3 = local_10;
    plVar5 = (long *)features_value_index_iterator::index(this,(char *)rhs,__c);
    if (lVar3 == *plVar5) {
      pfVar7 = features_value_iterator::value(&this->super_features_value_iterator);
      fVar8 = *pfVar7;
      pfVar7 = features_value_iterator::value(&local_28.super_features_value_iterator);
      *pfVar7 = fVar8 + *pfVar7;
    }
    else {
      pfVar7 = features_value_iterator::value(&local_28.super_features_value_iterator);
      fVar1 = *pfVar7;
      pfVar7 = features_value_iterator::value(&local_28.super_features_value_iterator);
      local_14 = fVar1 * *pfVar7 + local_14;
      features_value_index_iterator::operator++
                ((features_value_index_iterator *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      pfVar7 = features_value_iterator::value(&this->super_features_value_iterator);
      fVar8 = *pfVar7;
      pfVar7 = features_value_iterator::value(&local_28.super_features_value_iterator);
      *pfVar7 = fVar8;
      pcVar6 = features_value_index_iterator::index(this,(char *)rhs,__c_00);
      uVar2 = *(undefined8 *)pcVar6;
      pcVar6 = features_value_index_iterator::index(&local_28,(char *)rhs,__c_01);
      *(undefined8 *)pcVar6 = uVar2;
      plVar5 = (long *)features_value_index_iterator::index(this,(char *)rhs,__c_02);
      local_10 = *plVar5;
    }
    features_value_index_iterator::operator++
              ((features_value_index_iterator *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  }
  pfVar7 = features_value_iterator::value(&local_28.super_features_value_iterator);
  fVar8 = *pfVar7;
  pfVar7 = features_value_iterator::value(&local_28.super_features_value_iterator);
  local_14 = fVar8 * *pfVar7 + local_14;
  *(float *)(local_8 + 0x60) = local_14;
  features_value_index_iterator::operator++
            ((features_value_index_iterator *)CONCAT44(fVar8,in_stack_ffffffffffffff80));
  features::truncate_to((features *)in_stack_ffffffffffffffc0._begin,in_stack_ffffffffffffffb8);
  return local_14;
}

Assistant:

float collision_cleanup(features& fs)
{
  uint64_t last_index = (uint64_t)-1;
  float sum_sq = 0.f;
  features::iterator pos = fs.begin();
  for (features::iterator& f : fs)
  {
    if (last_index == f.index())
      pos.value() += f.value();
    else
    {
      sum_sq += pos.value() * pos.value();
      ++pos;
      pos.value() = f.value();
      pos.index() = f.index();
      last_index = f.index();
    }
  }

  sum_sq += pos.value() * pos.value();
  fs.sum_feat_sq = sum_sq;
  ++pos;
  fs.truncate_to(pos);

  return sum_sq;
}